

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void deqp::gls::ShaderExecUtil::BufferIoExecutor::copyFromBuffer
               (VarType *varType,VarLayout *layout,int numValues,void *srcBasePtr,void *dstBasePtr)

{
  DataType dataType;
  int iVar1;
  uint uVar2;
  InternalError *this;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  int local_84;
  string local_50;
  
  if (varType->m_type == TYPE_BASIC) {
    dataType = (varType->m_data).basic.type;
    bVar7 = dataType - TYPE_FLOAT_MAT2 < 9;
    bVar8 = dataType - TYPE_DOUBLE_MAT2 < 9;
    iVar1 = glu::getDataTypeScalarSize(dataType);
    uVar2 = 1;
    if (bVar8 || bVar7) {
      uVar2 = glu::getDataTypeMatrixNumColumns(dataType);
    }
    if (0 < numValues) {
      local_84 = 0;
      iVar4 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar6 = 0;
          iVar5 = local_84;
          do {
            iVar3 = layout->matrixStride * (int)uVar6;
            if (!bVar8 && !bVar7) {
              iVar3 = 0;
            }
            memcpy((void *)((long)dstBasePtr + (long)iVar5),
                   (void *)((long)(int)(iVar3 + layout->stride * iVar4 + layout->offset) +
                           (long)srcBasePtr),(long)(iVar1 / (int)uVar2) * 4);
            uVar6 = uVar6 + 1;
            iVar5 = iVar5 + (iVar1 / (int)uVar2) * 4;
          } while (uVar2 != uVar6);
        }
        iVar4 = iVar4 + 1;
        local_84 = local_84 + iVar1 * 4;
      } while (iVar4 != numValues);
    }
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unsupported type","");
  tcu::InternalError::InternalError(this,&local_50);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferIoExecutor::copyFromBuffer (const glu::VarType& varType, const VarLayout& layout, int numValues, const void* srcBasePtr, void* dstBasePtr)
{
	if (varType.isBasicType())
	{
		const glu::DataType		basicType		= varType.getBasicType();
		const bool				isMatrix		= glu::isDataTypeMatrix(basicType);
		const int				scalarSize		= glu::getDataTypeScalarSize(basicType);
		const int				numVecs			= isMatrix ? glu::getDataTypeMatrixNumColumns(basicType) : 1;
		const int				numComps		= scalarSize / numVecs;

		for (int elemNdx = 0; elemNdx < numValues; elemNdx++)
		{
			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				const int		srcOffset		= layout.offset + layout.stride*elemNdx + (isMatrix ? layout.matrixStride*vecNdx : 0);
				const int		dstOffset		= (int)sizeof(deUint32)*(elemNdx*scalarSize + vecNdx*numComps);
				const deUint8*	srcPtr			= (const deUint8*)srcBasePtr + srcOffset;
				deUint8*		dstPtr			= (deUint8*)dstBasePtr + dstOffset;

				deMemcpy(dstPtr, srcPtr, sizeof(deUint32)*numComps);
			}
		}
	}
	else
		throw tcu::InternalError("Unsupported type");
}